

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

bool Js::ReportModuleCompletion(SourceTextModuleRecord *module,Var exception)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ScriptContext *this;
  char16 *pcVar4;
  ThreadContext *pTVar5;
  HostScriptContext *pHVar6;
  Data local_78 [2];
  Data __exceptionCheck;
  undefined1 local_68 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  ScriptContext *scriptContext;
  bool hasCallback;
  Var exception_local;
  SourceTextModuleRecord *module_local;
  
  this = SourceTextModuleRecord::GetScriptContext(module);
  pcVar4 = SourceTextModuleRecord::GetSpecifierSz(module);
  Output::TraceWithFlush(ModulePhase,L"ReportModuleCompletion %s\n",pcVar4);
  pTVar5 = ScriptContext::GetThreadContext(this);
  bVar1 = ThreadContext::IsScriptActive(pTVar5);
  if (bVar1) {
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,this,&module_local);
    pTVar5 = ScriptContext::GetThreadContext(this);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_68,pTVar5);
    pHVar6 = ScriptContext::GetHostScriptContext(this);
    iVar3 = (*pHVar6->_vptr_HostScriptContext[0x16])(pHVar6,module,exception);
    bVar2 = (byte)iVar3;
    if (this != (ScriptContext *)0x0) {
      pTVar5 = ScriptContext::GetThreadContext(this);
      ThreadContext::DisposeOnLeaveScript(pTVar5);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_68);
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  }
  else {
    local_78[0] = ExceptionCheck::Save();
    pHVar6 = ScriptContext::GetHostScriptContext(this);
    iVar3 = (*pHVar6->_vptr_HostScriptContext[0x16])(pHVar6,module,exception);
    bVar2 = (byte)iVar3;
    ExceptionCheck::Restore(local_78);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

static bool ReportModuleCompletion(SourceTextModuleRecord* module, Var exception)
    {
        bool hasCallback = false;
        ScriptContext* scriptContext = module->GetScriptContext();
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ReportModuleCompletion %s\n"), module->GetSpecifierSz());
        LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
        {
            hasCallback = scriptContext->GetHostScriptContext()->ReportModuleCompletion(module, exception);
        });
        return hasCallback;
    }